

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::TruncateLogFile(char *path,int64 limit,int64 keep)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  ostream *poVar5;
  size_t sVar6;
  LogStream *pLVar7;
  SendMethod in_R9;
  long __offset;
  __off_t __offset_00;
  undefined1 local_20f8 [8];
  char copybuf [8192];
  stat statbuf;
  LogMessage local_40;
  
  iVar1 = strncmp("/proc/self/fd/",path,0xe);
  iVar1 = open(path,(uint)(iVar1 != 0) << 0x11 | 2);
  if (iVar1 == -1) {
    piVar4 = __errno_location();
    if (*piVar4 == 0x1b) {
      iVar1 = truncate(path,0);
      if (iVar1 != -1) {
        LogMessage::LogMessage
                  (&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                   ,0x911,2);
        pLVar7 = &(local_40.data_)->stream_;
        std::__ostream_insert<char,std::char_traits<char>>(&pLVar7->super_ostream,"Truncated ",10);
        if (path == (char *)0x0) {
          std::ios::clear((int)pLVar7 + (int)(pLVar7->super_ostream)._vptr_basic_ostream[-3]);
        }
        else {
          sVar3 = strlen(path);
          std::__ostream_insert<char,std::char_traits<char>>(&pLVar7->super_ostream,path,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pLVar7->super_ostream," due to EFBIG error",0x13);
        LogMessage::~LogMessage(&local_40);
        return;
      }
      ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                 ,0x90f,2,0,in_R9);
      pLVar7 = &(local_40.data_)->stream_;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pLVar7->super_ostream,"Unable to truncate ",0x13);
      if (path == (char *)0x0) {
        std::ios::clear((int)pLVar7 + (int)(pLVar7->super_ostream)._vptr_basic_ostream[-3]);
      }
      else {
        sVar3 = strlen(path);
        std::__ostream_insert<char,std::char_traits<char>>(&pLVar7->super_ostream,path,sVar3);
      }
    }
    else {
      ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                 ,0x914,2,0,in_R9);
      pLVar7 = &(local_40.data_)->stream_;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pLVar7->super_ostream,"Unable to open ",0xf);
      if (path == (char *)0x0) {
        std::ios::clear((int)pLVar7 + (int)(pLVar7->super_ostream)._vptr_basic_ostream[-3]);
      }
      else {
        sVar3 = strlen(path);
        std::__ostream_insert<char,std::char_traits<char>>(&pLVar7->super_ostream,path,sVar3);
      }
    }
    ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_40);
  }
  else {
    iVar2 = fstat(iVar1,(stat *)(copybuf + 0x1ff8));
    if (iVar2 == -1) {
      ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                 ,0x91a,2,0,in_R9);
      std::__ostream_insert<char,std::char_traits<char>>
                (&((local_40.data_)->stream_).super_ostream,"Unable to fstat()",0x11);
      ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_40);
    }
    else if ((((uint)statbuf.st_nlink & 0xf000) == 0x8000) &&
            (__offset = statbuf.st_rdev - keep,
            (__offset != 0 && keep <= (long)statbuf.st_rdev) && limit < (long)statbuf.st_rdev)) {
      LogMessage::LogMessage
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                 ,0x925);
      pLVar7 = &(local_40.data_)->stream_;
      std::__ostream_insert<char,std::char_traits<char>>(&pLVar7->super_ostream,"Truncating ",0xb);
      if (path == (char *)0x0) {
        std::ios::clear((int)pLVar7 + (int)(pLVar7->super_ostream)._vptr_basic_ostream[-3]);
      }
      else {
        sVar3 = strlen(path);
        std::__ostream_insert<char,std::char_traits<char>>(&pLVar7->super_ostream,path,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(&pLVar7->super_ostream," to ",4);
      poVar5 = std::ostream::_M_insert<long>((long)pLVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," bytes",6);
      LogMessage::~LogMessage(&local_40);
      sVar3 = pread(iVar1,local_20f8,0x2000,__offset);
      __offset_00 = 0;
      if (0 < (long)sVar3) {
        do {
          sVar6 = pwrite(iVar1,local_20f8,sVar3,__offset_00);
          if (sVar6 == 0xffffffffffffffff) {
            ErrnoLogMessage::ErrnoLogMessage
                      ((ErrnoLogMessage *)&local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                       ,0x92e,2,0,in_R9);
            pLVar7 = &(local_40.data_)->stream_;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&pLVar7->super_ostream,"Unable to write to ",0x13);
            if (path == (char *)0x0) {
              std::ios::clear((int)pLVar7 + (int)(pLVar7->super_ostream)._vptr_basic_ostream[-3]);
            }
            else {
              sVar3 = strlen(path);
              std::__ostream_insert<char,std::char_traits<char>>(&pLVar7->super_ostream,path,sVar3);
            }
            ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_40);
            goto LAB_0011857b;
          }
          if (sVar6 != sVar3) {
            LogMessage::LogMessage
                      (&local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                       ,0x931,2);
            pLVar7 = &(local_40.data_)->stream_;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&pLVar7->super_ostream,"Expected to write ",0x12);
            poVar5 = std::ostream::_M_insert<long>((long)pLVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", wrote ",8);
            std::ostream::_M_insert<long>((long)poVar5);
            LogMessage::~LogMessage(&local_40);
          }
          __offset = __offset + sVar3;
          __offset_00 = __offset_00 + sVar6;
          sVar3 = pread(iVar1,local_20f8,0x2000,__offset);
        } while (0 < (long)sVar3);
      }
      if (sVar3 == 0xffffffffffffffff) {
        ErrnoLogMessage::ErrnoLogMessage
                  ((ErrnoLogMessage *)&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                   ,0x936,2,0,in_R9);
        pLVar7 = &(local_40.data_)->stream_;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pLVar7->super_ostream,"Unable to read from ",0x14);
        if (path == (char *)0x0) {
          std::ios::clear((int)pLVar7 + (int)(pLVar7->super_ostream)._vptr_basic_ostream[-3]);
        }
        else {
          sVar3 = strlen(path);
          std::__ostream_insert<char,std::char_traits<char>>(&pLVar7->super_ostream,path,sVar3);
        }
        ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_40);
      }
LAB_0011857b:
      iVar2 = ftruncate(iVar1,__offset_00);
      if (iVar2 == -1) {
        ErrnoLogMessage::ErrnoLogMessage
                  ((ErrnoLogMessage *)&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                   ,0x93c,2,0,in_R9);
        pLVar7 = &(local_40.data_)->stream_;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pLVar7->super_ostream,"Unable to truncate ",0x13);
        if (path == (char *)0x0) {
          std::ios::clear((int)pLVar7 + (int)(pLVar7->super_ostream)._vptr_basic_ostream[-3]);
        }
        else {
          sVar3 = strlen(path);
          std::__ostream_insert<char,std::char_traits<char>>(&pLVar7->super_ostream,path,sVar3);
        }
        ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_40);
      }
    }
    close(iVar1);
  }
  return;
}

Assistant:

void TruncateLogFile(const char *path, int64 limit, int64 keep) {
#ifdef HAVE_UNISTD_H
  struct stat statbuf;
  const int kCopyBlockSize = 8 << 10;
  char copybuf[kCopyBlockSize];
  off_t read_offset, write_offset;
  // Don't follow symlinks unless they're our own fd symlinks in /proc
  int flags = O_RDWR;
  // TODO(hamaji): Support other environments.
#ifdef GLOG_OS_LINUX
  const char *procfd_prefix = "/proc/self/fd/";
  if (strncmp(procfd_prefix, path, strlen(procfd_prefix))) flags |= O_NOFOLLOW;
#endif

  int fd = open(path, flags);
  if (fd == -1) {
    if (errno == EFBIG) {
      // The log file in question has got too big for us to open. The
      // real fix for this would be to compile logging.cc (or probably
      // all of base/...) with -D_FILE_OFFSET_BITS=64 but that's
      // rather scary.
      // Instead just truncate the file to something we can manage
      if (truncate(path, 0) == -1) {
        PLOG(ERROR) << "Unable to truncate " << path;
      } else {
        LOG(ERROR) << "Truncated " << path << " due to EFBIG error";
      }
    } else {
      PLOG(ERROR) << "Unable to open " << path;
    }
    return;
  }

  if (fstat(fd, &statbuf) == -1) {
    PLOG(ERROR) << "Unable to fstat()";
    goto out_close_fd;
  }

  // See if the path refers to a regular file bigger than the
  // specified limit
  if (!S_ISREG(statbuf.st_mode)) goto out_close_fd;
  if (statbuf.st_size <= limit)  goto out_close_fd;
  if (statbuf.st_size <= keep) goto out_close_fd;

  // This log file is too large - we need to truncate it
  LOG(INFO) << "Truncating " << path << " to " << keep << " bytes";

  // Copy the last "keep" bytes of the file to the beginning of the file
  read_offset = statbuf.st_size - keep;
  write_offset = 0;
  ssize_t bytesin, bytesout;
  while ((bytesin = pread(fd, copybuf, sizeof(copybuf), read_offset)) > 0) {
    bytesout = pwrite(fd, copybuf, static_cast<size_t>(bytesin), write_offset);
    if (bytesout == -1) {
      PLOG(ERROR) << "Unable to write to " << path;
      break;
    } else if (bytesout != bytesin) {
      LOG(ERROR) << "Expected to write " << bytesin << ", wrote " << bytesout;
    }
    read_offset += bytesin;
    write_offset += bytesout;
  }
  if (bytesin == -1) PLOG(ERROR) << "Unable to read from " << path;

  // Truncate the remainder of the file. If someone else writes to the
  // end of the file after our last read() above, we lose their latest
  // data. Too bad ...
  if (ftruncate(fd, write_offset) == -1) {
    PLOG(ERROR) << "Unable to truncate " << path;
  }

 out_close_fd:
  close(fd);
#else
  LOG(ERROR) << "No log truncation support.";
#endif
}